

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getters-setters.c
# Opt level: O2

int run_test_req_type_name(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_10;
  
  pcVar2 = uv_req_type_name(UV_REQ);
  iVar1 = strcmp(pcVar2,"req");
  if (iVar1 == 0) {
    pcVar2 = uv_req_type_name(UV_UDP_SEND);
    iVar1 = strcmp(pcVar2,"udp_send");
    if (iVar1 == 0) {
      pcVar2 = uv_req_type_name(UV_WORK);
      iVar1 = strcmp(pcVar2,"work");
      if (iVar1 == 0) {
        pcVar2 = uv_req_type_name(UV_REQ_TYPE_MAX);
        if (pcVar2 == (char *)0x0) {
          pcVar2 = uv_req_type_name(UV_GETADDRINFO|UV_SHUTDOWN);
          if (pcVar2 == (char *)0x0) {
            pcVar2 = uv_req_type_name(UV_UNKNOWN_REQ);
            if (pcVar2 == (char *)0x0) {
              return 0;
            }
            pcVar2 = "uv_req_type_name(UV_UNKNOWN_REQ) == NULL";
            uStack_10 = 0x1c;
          }
          else {
            pcVar2 = "uv_req_type_name(UV_REQ_TYPE_MAX + 1) == NULL";
            uStack_10 = 0x1b;
          }
        }
        else {
          pcVar2 = "uv_req_type_name(UV_REQ_TYPE_MAX) == NULL";
          uStack_10 = 0x1a;
        }
      }
      else {
        pcVar2 = "strcmp(uv_req_type_name(UV_WORK), \"work\") == 0";
        uStack_10 = 0x19;
      }
    }
    else {
      pcVar2 = "strcmp(uv_req_type_name(UV_UDP_SEND), \"udp_send\") == 0";
      uStack_10 = 0x18;
    }
  }
  else {
    pcVar2 = "strcmp(uv_req_type_name(UV_REQ), \"req\") == 0";
    uStack_10 = 0x17;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
          ,uStack_10,pcVar2);
  abort();
}

Assistant:

TEST_IMPL(req_type_name) {
  ASSERT(strcmp(uv_req_type_name(UV_REQ), "req") == 0);
  ASSERT(strcmp(uv_req_type_name(UV_UDP_SEND), "udp_send") == 0);
  ASSERT(strcmp(uv_req_type_name(UV_WORK), "work") == 0);
  ASSERT(uv_req_type_name(UV_REQ_TYPE_MAX) == NULL);
  ASSERT(uv_req_type_name(UV_REQ_TYPE_MAX + 1) == NULL);
  ASSERT(uv_req_type_name(UV_UNKNOWN_REQ) == NULL);
  return 0;
}